

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags.cc
# Opt level: O2

bool __thiscall gflags::anon_unknown_2::FlagValue::ParseFrom(FlagValue *this,char *value)

{
  char cVar1;
  int iVar2;
  int *piVar3;
  ulonglong uVar4;
  size_t sVar5;
  ulonglong uVar6;
  long lVar7;
  char *end;
  double local_38;
  
  cVar1 = this->type_;
  if (cVar1 == '\x06') {
    std::__cxx11::string::assign((char *)this->value_buffer_);
    return true;
  }
  if (cVar1 == '\0') {
    lVar7 = 0;
    while( true ) {
      if (lVar7 == 0x14) {
        return false;
      }
      iVar2 = strcasecmp(value,(char *)((long)&DAT_001131dc +
                                       (long)*(int *)((long)&DAT_001131dc + lVar7)));
      if (iVar2 == 0) break;
      iVar2 = strcasecmp(value,(char *)((long)&DAT_001131f0 +
                                       (long)*(int *)((long)&DAT_001131f0 + lVar7)));
      lVar7 = lVar7 + 4;
      if (iVar2 == 0) {
        *(undefined1 *)this->value_buffer_ = 0;
        return true;
      }
    }
    *(undefined1 *)this->value_buffer_ = 1;
    return true;
  }
  if (*value == '\0') {
    return false;
  }
  if (*value == '0') {
    iVar2 = 10;
    if ((value[1] + 0xa8U & 0xdf) == 0) {
      iVar2 = 0x10;
    }
  }
  else {
    iVar2 = 10;
  }
  piVar3 = __errno_location();
  *piVar3 = 0;
  switch(cVar1) {
  case '\x01':
    uVar4 = strtoll(value,&end,iVar2);
    if (*piVar3 != 0) {
      return false;
    }
    sVar5 = strlen(value);
    if (end != value + sVar5) {
      return false;
    }
    uVar6 = uVar4 + 0x80000000;
    break;
  case '\x02':
    for (; *value == ' '; value = value + 1) {
    }
    if (*value == '-') {
      return false;
    }
    uVar6 = strtoull(value,&end,iVar2);
    if (*piVar3 != 0) {
      return false;
    }
    sVar5 = strlen(value);
    uVar4 = uVar6;
    if (value + sVar5 != end) {
      return false;
    }
    break;
  case '\x03':
    uVar6 = strtoll(value,&end,iVar2);
    if (*piVar3 != 0) {
      return false;
    }
    sVar5 = strlen(value);
    if (end != value + sVar5) {
      return false;
    }
    goto LAB_0010d372;
  case '\x04':
    for (; *value == ' '; value = value + 1) {
    }
    if (*value == '-') {
      return false;
    }
    uVar6 = strtoull(value,&end,iVar2);
    if (*piVar3 != 0) {
      return false;
    }
    sVar5 = strlen(value);
    if (value + sVar5 != end) {
      return false;
    }
LAB_0010d372:
    *(ulonglong *)this->value_buffer_ = uVar6;
    return true;
  case '\x05':
    local_38 = strtod(value,&end);
    if (*piVar3 != 0) {
      return false;
    }
    sVar5 = strlen(value);
    if (end != value + sVar5) {
      return false;
    }
    *(double *)this->value_buffer_ = local_38;
    return true;
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/jarulraj[P]sqlcheck/external/gflags/src/gflags.cc"
                  ,0x16c,"bool gflags::(anonymous namespace)::FlagValue::ParseFrom(const char *)");
  }
  if (uVar6 >> 0x20 == 0) {
    *(int *)this->value_buffer_ = (int)uVar4;
    return true;
  }
  return false;
}

Assistant:

bool FlagValue::ParseFrom(const char* value) {
  if (type_ == FV_BOOL) {
    const char* kTrue[] = { "1", "t", "true", "y", "yes" };
    const char* kFalse[] = { "0", "f", "false", "n", "no" };
    COMPILE_ASSERT(sizeof(kTrue) == sizeof(kFalse), true_false_equal);
    for (size_t i = 0; i < sizeof(kTrue)/sizeof(*kTrue); ++i) {
      if (strcasecmp(value, kTrue[i]) == 0) {
        SET_VALUE_AS(bool, true);
        return true;
      } else if (strcasecmp(value, kFalse[i]) == 0) {
        SET_VALUE_AS(bool, false);
        return true;
      }
    }
    return false;   // didn't match a legal input

  } else if (type_ == FV_STRING) {
    SET_VALUE_AS(string, value);
    return true;
  }

  // OK, it's likely to be numeric, and we'll be using a strtoXXX method.
  if (value[0] == '\0')   // empty-string is only allowed for string type.
    return false;
  char* end;
  // Leading 0x puts us in base 16.  But leading 0 does not put us in base 8!
  // It caused too many bugs when we had that behavior.
  int base = 10;    // by default
  if (value[0] == '0' && (value[1] == 'x' || value[1] == 'X'))
    base = 16;
  errno = 0;

  switch (type_) {
    case FV_INT32: {
      const int64 r = strto64(value, &end, base);
      if (errno || end != value + strlen(value))  return false;  // bad parse
      if (static_cast<int32>(r) != r)  // worked, but number out of range
        return false;
      SET_VALUE_AS(int32, static_cast<int32>(r));
      return true;
    }
    case FV_UINT32: {
      while (*value == ' ') value++;
      if (*value == '-') return false;  // negative number
      const uint64 r = strtou64(value, &end, base);
      if (errno || end != value + strlen(value))  return false;  // bad parse
        if (static_cast<uint32>(r) != r)  // worked, but number out of range
        return false;
      SET_VALUE_AS(uint32, static_cast<uint32>(r));
      return true;
    }
    case FV_INT64: {
      const int64 r = strto64(value, &end, base);
      if (errno || end != value + strlen(value))  return false;  // bad parse
      SET_VALUE_AS(int64, r);
      return true;
    }
    case FV_UINT64: {
      while (*value == ' ') value++;
      if (*value == '-') return false;  // negative number
      const uint64 r = strtou64(value, &end, base);
      if (errno || end != value + strlen(value))  return false;  // bad parse
      SET_VALUE_AS(uint64, r);
      return true;
    }
    case FV_DOUBLE: {
      const double r = strtod(value, &end);
      if (errno || end != value + strlen(value))  return false;  // bad parse
      SET_VALUE_AS(double, r);
      return true;
    }
    default: {
      assert(false);  // unknown type
      return false;
    }
  }
}